

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int parse_miniscript(char *miniscript,char **key_name_array,char **key_value_array,size_t array_len,
                    uint32_t flags,uint32_t target,uint32_t *network,uint32_t descriptor_depth,
                    uint32_t descriptor_index,wally_descriptor_script_item *script_item,
                    size_t item_len,uint32_t *properties,char **script_ignore_checksum)

{
  uint32_t derive_child_num;
  char *pcVar1;
  char *pcVar2;
  wally_descriptor_script_item *pwVar3;
  ulong uVar4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  uchar *bytes;
  uchar *puVar8;
  miniscript_node_t *node;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  miniscript_node_t *local_58;
  size_t local_50;
  uchar *local_48;
  size_t local_40;
  wally_descriptor_script_item *local_38;
  
  local_58 = (miniscript_node_t *)0x0;
  if (miniscript == (char *)0x0 || 1 < flags) {
    return -2;
  }
  if (array_len == 0) {
    if (key_name_array != (char **)0x0 || key_value_array != (char **)0x0) {
      return -2;
    }
  }
  else if (key_name_array == (char **)0x0 || key_value_array == (char **)0x0) {
    return -2;
  }
  cVar12 = *miniscript;
  if (cVar12 != '\0') {
    uVar10 = 0;
    do {
      if (1000000 < uVar10) {
        return -2;
      }
      if ((byte)(cVar12 + 0x81U) < 0xa1) {
        return -2;
      }
      cVar12 = miniscript[uVar10 + 1];
      uVar10 = uVar10 + 1;
    } while (cVar12 != '\0');
  }
  if (array_len == 0) {
    array_len = 0;
  }
  else {
    sVar7 = 0;
    do {
      pcVar1 = key_name_array[sVar7];
      if (pcVar1 == (char *)0x0) {
        return -2;
      }
      pcVar2 = key_value_array[sVar7];
      if (pcVar2 == (char *)0x0) {
        return -2;
      }
      cVar12 = *pcVar1;
      if (cVar12 != '\0') {
        uVar10 = 0;
        do {
          if (0x10 < uVar10) {
            return -2;
          }
          if ((byte)(cVar12 + 0x81U) < 0xa1) {
            return -2;
          }
          cVar12 = pcVar1[uVar10 + 1];
          uVar10 = uVar10 + 1;
        } while (cVar12 != '\0');
      }
      cVar12 = *pcVar2;
      if (cVar12 != '\0') {
        uVar10 = 0;
        do {
          if (0x82 < uVar10) {
            return -2;
          }
          if ((byte)(cVar12 + 0x81U) < 0xa1) {
            return -2;
          }
          cVar12 = pcVar2[uVar10 + 1];
          uVar10 = uVar10 + 1;
        } while (cVar12 != '\0');
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != array_len);
  }
  iVar5 = analyze_miniscript(miniscript,key_name_array,key_value_array,array_len,target,network,
                             flags,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,&local_58,
                             (char **)properties);
  if (iVar5 != 0) {
LAB_004a03e1:
    bytes = (uchar *)0x0;
    uVar10 = 0;
    goto LAB_004a03e7;
  }
  if ((target & 2) != 0) {
    iVar5 = -2;
    if (local_58->info == (miniscript_item_t *)0x0) goto LAB_004a03e1;
    bytes = (uchar *)0x0;
    uVar10 = 0;
    if ((local_58->info->kind & 2) == 0) goto LAB_004a03e7;
  }
  iVar5 = 0;
  if (item_len == 0 || script_item == (wally_descriptor_script_item *)0x0) goto LAB_004a040d;
  uVar10 = 0;
  bytes = (uchar *)0x0;
  sVar7 = 0;
  do {
    sVar9 = sVar7;
    uVar4 = uVar10;
    if (script_item[sVar7].script == (uchar *)0x0) {
      puVar8 = bytes;
      uVar11 = uVar10;
      if (bytes == (uchar *)0x0) {
        local_50 = sVar7;
        bytes = (uchar *)wally_malloc(1000000);
        sVar9 = local_50;
        puVar8 = bytes;
        uVar11 = 1000000;
        uVar4 = 1000000;
        if (bytes == (uchar *)0x0) {
          iVar5 = -3;
          bytes = (uchar *)0x0;
          goto LAB_004a03e7;
        }
      }
    }
    else {
      puVar8 = script_item[sVar7].script;
      uVar11 = script_item[sVar7].script_len;
    }
    uVar10 = uVar4;
    derive_child_num = script_item[sVar7].child_num;
    local_40 = 0;
    node = local_58;
    uVar6 = descriptor_depth;
    if (descriptor_depth != 0) {
      do {
        node = node->child;
        if (node == (miniscript_node_t *)0x0) goto LAB_004a0627;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    uVar6 = descriptor_index;
    if (descriptor_index != 0) {
      do {
        node = node->next;
        if (node == (miniscript_node_t *)0x0) goto LAB_004a0627;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    local_50 = sVar9;
    local_48 = puVar8;
    local_38 = script_item + sVar7;
    puVar8 = (uchar *)wally_malloc(1000000);
    if (puVar8 == (uchar *)0x0) {
      iVar5 = -3;
      goto LAB_004a03e7;
    }
    iVar5 = generate_script_from_miniscript
                      (node,(miniscript_node_t *)0x0,derive_child_num,puVar8,1000000,&local_40);
    sVar7 = 0;
    if ((iVar5 == 0) && (sVar7 = local_40, local_40 <= uVar11)) {
      memcpy(local_48,puVar8,local_40);
    }
    wally_bzero(puVar8,1000000);
    wally_free(puVar8);
    pwVar3 = local_38;
    if (iVar5 != 0) goto LAB_004a03e7;
    if (local_38->script == (uchar *)0x0) {
      puVar8 = (uchar *)wally_malloc(sVar7);
      pwVar3->script = puVar8;
      if (puVar8 == (uchar *)0x0) {
        iVar5 = -3;
        goto LAB_004a03e7;
      }
      memcpy(puVar8,local_48,sVar7);
    }
    pwVar3->script_len = sVar7;
    sVar7 = local_50 + 1;
    iVar5 = 0;
  } while (sVar7 != item_len);
LAB_004a03f5:
  if (bytes != (uchar *)0x0) {
    wally_bzero(bytes,uVar10);
    wally_free(bytes);
  }
LAB_004a040d:
  free_miniscript_node(local_58);
  return iVar5;
LAB_004a0627:
  iVar5 = -2;
LAB_004a03e7:
  if (properties != (uint32_t *)0x0) {
    wally_free_string(*(char **)properties);
  }
  goto LAB_004a03f5;
}

Assistant:

static int parse_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    uint32_t target,
    uint32_t *network,
    uint32_t descriptor_depth,
    uint32_t descriptor_index,
    struct wally_descriptor_script_item *script_item,
    size_t item_len,
    uint32_t *properties,
    char **script_ignore_checksum)
{
    int ret;
    size_t index;
    unsigned char *work_script = NULL;
    size_t work_script_len = 0;
    unsigned char *temp_script = NULL;
    size_t temp_script_len = 0;
    size_t write_len;
    struct miniscript_node_t *top_node = NULL;
    bool is_tapscript = false;

    if (((flags & ~0x1) != 0) ||
        !miniscript || (array_len && (!key_name_array || !key_value_array)) ||
        (!array_len && (key_name_array || key_value_array)) ||
        check_ascii_string(miniscript, DESCRIPTOR_LIMIT_LENGTH))
        return WALLY_EINVAL;

    if (array_len) {
        for (index = 0; index < array_len; ++index) {
            if (!key_name_array[index] || !key_value_array[index])
                return WALLY_EINVAL;
            if (check_ascii_string(key_name_array[index], DESCRIPTOR_KEY_NAME_MAX_LENGTH) ||
                check_ascii_string(key_value_array[index], DESCRIPTOR_KEY_VALUE_MAX_LENGTH)) {
                return WALLY_EINVAL;
            }
        }
    }

    ret = analyze_miniscript(miniscript, key_name_array, key_value_array, array_len,
                             target, network, flags,
                             NULL, NULL, &top_node, script_ignore_checksum);
    if ((ret == WALLY_OK) && (target & DESCRIPTOR_KIND_DESCRIPTOR) &&
        (!top_node->info || !(top_node->info->kind & DESCRIPTOR_KIND_DESCRIPTOR)))
        ret = WALLY_EINVAL;
    if ((ret == WALLY_OK) && script_item) {
        for (index = 0; index < item_len; ++index) {
            write_len = 0;

            temp_script = script_item[index].script;
            temp_script_len = script_item[index].script_len;
            if (!temp_script) {
                if (!work_script) {
                    work_script = (unsigned char *)wally_malloc(DESCRIPTOR_LIMIT_LENGTH);
                    if (!work_script) {
                        ret = WALLY_ENOMEM;
                        break;
                    }
                    work_script_len = DESCRIPTOR_LIMIT_LENGTH;
                }
                temp_script = work_script;
                temp_script_len = work_script_len;
            }
            ret = convert_script_from_node(top_node, script_item[index].child_num,
                                           descriptor_depth, descriptor_index,
                                           temp_script, temp_script_len,
                                           &write_len);
            if (ret != WALLY_OK)
                break;
            if (!script_item[index].script) {
                script_item[index].script = (unsigned char *)wally_malloc(write_len);
                if (!script_item[index].script) {
                    ret = WALLY_ENOMEM;
                    break;
                }
                memcpy(script_item[index].script, temp_script, write_len);
            }
            script_item[index].script_len = write_len;
        }
    }
    if ((ret == WALLY_OK) && properties)
        *properties = top_node->type_properties;

    if ((ret != WALLY_OK) && script_ignore_checksum)
        wally_free_string(*script_ignore_checksum);
    if (work_script) {
        wally_bzero(work_script, work_script_len);
        wally_free(work_script);
    }
    free_miniscript_node(top_node);
    return ret;
}